

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

DdManager *
Llb4_Nonlin4SweepGroups
          (Aig_Man_t *pAig,Vec_Int_t *vOrder,int nVars,Vec_Ptr_t **pvGroups,int nBddLimitClp,
          int fVerbose)

{
  Vec_Int_t *vVars2Q_00;
  DdManager *dd_00;
  Vec_Ptr_t *vParts_00;
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *vVars2Q;
  Vec_Ptr_t *vParts;
  DdManager *dd;
  int fVerbose_local;
  int nBddLimitClp_local;
  Vec_Ptr_t **pvGroups_local;
  int nVars_local;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  
  vVars2Q_00 = Llb_Nonlin4SweepVars2Q(pAig,vOrder,1);
  dd_00 = Cudd_Init(nVars,0,0x100,0x40000,0);
  vParts_00 = Llb_Nonlin4SweepPartitions(dd_00,pAig,vOrder,1);
  Cudd_AutodynEnable(dd_00,CUDD_REORDER_SYMM_SIFT);
  pVVar1 = Llb_Nonlin4Group(dd_00,vParts_00,vVars2Q_00,nBddLimitClp);
  *pvGroups = pVVar1;
  Llb_Nonlin4SweepDeref(dd_00,vParts_00);
  if (fVerbose != 0) {
    printf("Groups: ");
    Llb_Nonlin4SweepPrint(*pvGroups);
  }
  Vec_IntFree(vVars2Q_00);
  return dd_00;
}

Assistant:

DdManager * Llb4_Nonlin4SweepGroups( Aig_Man_t * pAig, Vec_Int_t * vOrder, int nVars, Vec_Ptr_t ** pvGroups, int nBddLimitClp, int fVerbose )
{
    DdManager * dd;
    Vec_Ptr_t * vParts;
    Vec_Int_t * vVars2Q;
    // get quantifiable variables
    vVars2Q = Llb_Nonlin4SweepVars2Q( pAig, vOrder, 1 );
    // start BDD manager and create partitions 
    dd = Cudd_Init( nVars, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    vParts = Llb_Nonlin4SweepPartitions( dd, pAig, vOrder, 1 );
//printf( "Transitions: " );
//Llb_Nonlin4SweepPrint( vParts );
    // compute image of the partitions

    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    *pvGroups = Llb_Nonlin4Group( dd, vParts, vVars2Q, nBddLimitClp );
    Llb_Nonlin4SweepDeref( dd, vParts );
//    *pvGroups = vParts;

if ( fVerbose )
{
printf( "Groups: " );
Llb_Nonlin4SweepPrint( *pvGroups );
}

    Vec_IntFree( vVars2Q );
    return dd;
}